

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall TasGrid::GridWavelet::updateAccelerationData(GridWavelet *this,ChangeType change)

{
  bool bVar1;
  int iVar2;
  WaveletBasisMatrix local_1d8;
  WaveletBasisMatrix local_f0;
  ChangeType local_14;
  GridWavelet *pGStack_10;
  ChangeType change_local;
  GridWavelet *this_local;
  
  local_14 = change;
  pGStack_10 = this;
  if (change == change_gpu_device) {
    ::std::
    unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ::reset(&this->gpu_cache,(pointer)0x0);
    ::std::
    unique_ptr<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
    ::reset(&this->gpu_cachef,(pointer)0x0);
    iVar2 = TasSparse::WaveletBasisMatrix::getNumRows(&this->inter_matrix);
    if (0 < iVar2) {
      TasSparse::WaveletBasisMatrix::WaveletBasisMatrix(&local_f0);
      TasSparse::WaveletBasisMatrix::operator=(&this->inter_matrix,&local_f0);
      TasSparse::WaveletBasisMatrix::~WaveletBasisMatrix(&local_f0);
    }
  }
  else if ((change == change_sparse_dense) &&
          (((((this->super_BaseCanonicalGrid).acceleration)->algorithm_select == algorithm_dense &&
            (bVar1 = TasSparse::WaveletBasisMatrix::isSparse(&this->inter_matrix), bVar1)) ||
           ((((this->super_BaseCanonicalGrid).acceleration)->algorithm_select == algorithm_sparse &&
            (bVar1 = TasSparse::WaveletBasisMatrix::isDense(&this->inter_matrix), bVar1)))))) {
    TasSparse::WaveletBasisMatrix::WaveletBasisMatrix(&local_1d8);
    TasSparse::WaveletBasisMatrix::operator=(&this->inter_matrix,&local_1d8);
    TasSparse::WaveletBasisMatrix::~WaveletBasisMatrix(&local_1d8);
  }
  return;
}

Assistant:

void GridWavelet::updateAccelerationData(AccelerationContext::ChangeType change) const{
    switch(change){
        case AccelerationContext::change_gpu_device:
            gpu_cache.reset();
            gpu_cachef.reset();
            if (inter_matrix.getNumRows() > 0)
                inter_matrix = TasSparse::WaveletBasisMatrix();
            break;
        case AccelerationContext::change_sparse_dense:
            if ((acceleration->algorithm_select == AccelerationContext::algorithm_dense and inter_matrix.isSparse())
                or (acceleration->algorithm_select == AccelerationContext::algorithm_sparse and inter_matrix.isDense()))
                inter_matrix = TasSparse::WaveletBasisMatrix();
            break;
        default:
            break;
    }
}